

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O3

void duckdb::MapExtractListFunc(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  int iVar2;
  idx_t count;
  data_ptr_t pdVar3;
  long lVar4;
  Vector *pVVar5;
  reference target_v;
  Vector *source_v;
  Vector *this;
  idx_t iVar6;
  VectorBuffer *pVVar7;
  idx_t iVar8;
  idx_t iVar9;
  long lVar10;
  data_ptr_t pdVar11;
  UnifiedVectorFormat pos_format;
  UnifiedVectorFormat lst_format;
  Vector pos_vec;
  UnifiedVectorFormat val_format;
  LogicalType local_188;
  UnifiedVectorFormat local_170;
  UnifiedVectorFormat local_128;
  Vector local_e0;
  UnifiedVectorFormat local_78;
  
  count = args->count;
  pVVar5 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  target_v = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  if (((pVVar5->type).id_ != SQLNULL) && ((target_v->type).id_ != SQLNULL)) {
    source_v = MapVector::GetKeys(pVVar5);
    this = MapVector::GetValues(pVVar5);
    LogicalType::LogicalType(&local_188,INTEGER);
    Vector::Vector(&local_e0,&local_188,count);
    LogicalType::~LogicalType(&local_188);
    ListSearchOp<true>(pVVar5,source_v,target_v,&local_e0,args->count);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_170);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
    iVar6 = ListVector::GetListSize(pVVar5);
    Vector::ToUnifiedFormat(this,iVar6,&local_78);
    Vector::ToUnifiedFormat(&local_e0,count,&local_170);
    Vector::ToUnifiedFormat(pVVar5,count,&local_128);
    VVar1 = pVVar5->vector_type;
    while (VVar1 == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(pVVar5);
      pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pVVar5->auxiliary);
      pVVar5 = (Vector *)(pVVar7 + 1);
      VVar1 = *(VectorType *)&pVVar7[1]._vptr_VectorBuffer;
    }
    pdVar3 = pVVar5->data;
    VVar1 = result->vector_type;
    pVVar5 = result;
    while (VVar1 == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(pVVar5);
      pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pVVar5->auxiliary);
      pVVar5 = (Vector *)(pVVar7 + 1);
      VVar1 = *(VectorType *)&pVVar7[1]._vptr_VectorBuffer;
    }
    if (count != 0) {
      pdVar11 = pVVar5->data + 8;
      lVar10 = 0;
      iVar6 = 0;
      do {
        iVar8 = iVar6;
        if ((local_128.sel)->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)(local_128.sel)->sel_vector[iVar6];
        }
        if ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar8 >> 6]
             >> (iVar8 & 0x3f) & 1) != 0)) {
          iVar9 = iVar6;
          if ((local_170.sel)->sel_vector != (sel_t *)0x0) {
            iVar9 = (idx_t)(local_170.sel)->sel_vector[iVar6];
          }
          if ((local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)) {
            lVar4 = *(long *)(pdVar3 + iVar8 * 0x10);
            iVar2 = *(int *)(local_170.data + iVar9 * 4);
            *(long *)(pdVar11 + -8) = lVar10;
            pdVar11[0] = '\x01';
            pdVar11[1] = '\0';
            pdVar11[2] = '\0';
            pdVar11[3] = '\0';
            pdVar11[4] = '\0';
            pdVar11[5] = '\0';
            pdVar11[6] = '\0';
            pdVar11[7] = '\0';
            ListVector::Append(result,this,iVar2 + lVar4,(long)iVar2 + -1 + lVar4);
            lVar10 = lVar10 + 1;
          }
          else {
            *(long *)(pdVar11 + -8) = lVar10;
            pdVar11[0] = '\0';
            pdVar11[1] = '\0';
            pdVar11[2] = '\0';
            pdVar11[3] = '\0';
            pdVar11[4] = '\0';
            pdVar11[5] = '\0';
            pdVar11[6] = '\0';
            pdVar11[7] = '\0';
          }
        }
        else {
          FlatVector::SetNull(result,iVar6,true);
        }
        iVar6 = iVar6 + 1;
        pdVar11 = pdVar11 + 0x10;
      } while (count != iVar6);
    }
    if (args->count == 1) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    Vector::Verify(result,count);
    if (local_128.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_170.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_e0.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_e0.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_e0.type);
    return;
  }
  ListVector::SetListSize(result,0);
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  pdVar3 = result->data;
  pdVar3[0] = '\0';
  pdVar3[1] = '\0';
  pdVar3[2] = '\0';
  pdVar3[3] = '\0';
  pdVar3[4] = '\0';
  pdVar3[5] = '\0';
  pdVar3[6] = '\0';
  pdVar3[7] = '\0';
  pdVar3[8] = '\0';
  pdVar3[9] = '\0';
  pdVar3[10] = '\0';
  pdVar3[0xb] = '\0';
  pdVar3[0xc] = '\0';
  pdVar3[0xd] = '\0';
  pdVar3[0xe] = '\0';
  pdVar3[0xf] = '\0';
  Vector::Verify(result,count);
  return;
}

Assistant:

static void MapExtractListFunc(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto count = args.size();

	auto &map_vec = args.data[0];
	auto &arg_vec = args.data[1];

	const auto map_is_null = map_vec.GetType().id() == LogicalTypeId::SQLNULL;
	const auto arg_is_null = arg_vec.GetType().id() == LogicalTypeId::SQLNULL;

	if (map_is_null || arg_is_null) {
		// Short-circuit if either the map or the arg is NULL
		ListVector::SetListSize(result, 0);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<list_entry_t>(result)[0] = {0, 0};
		result.Verify(count);
		return;
	}

	auto &key_vec = MapVector::GetKeys(map_vec);
	auto &val_vec = MapVector::GetValues(map_vec);

	// Collect the matching positions
	Vector pos_vec(LogicalType::INTEGER, count);
	ListSearchOp<true>(map_vec, key_vec, arg_vec, pos_vec, args.size());

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat pos_format;
	UnifiedVectorFormat lst_format;

	val_vec.ToUnifiedFormat(ListVector::GetListSize(map_vec), val_format);
	pos_vec.ToUnifiedFormat(count, pos_format);
	map_vec.ToUnifiedFormat(count, lst_format);

	const auto pos_data = UnifiedVectorFormat::GetData<int32_t>(pos_format);
	const auto inc_list_data = ListVector::GetData(map_vec);
	const auto out_list_data = ListVector::GetData(result);

	idx_t offset = 0;
	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		const auto lst_idx = lst_format.sel->get_index(row_idx);
		if (!lst_format.validity.RowIsValid(lst_idx)) {
			FlatVector::SetNull(result, row_idx, true);
			continue;
		}

		auto &inc_list = inc_list_data[lst_idx];
		auto &out_list = out_list_data[row_idx];

		const auto pos_idx = pos_format.sel->get_index(row_idx);
		if (!pos_format.validity.RowIsValid(pos_idx)) {
			// We didnt find the key in the map, so return emptyl ist
			out_list.offset = offset;
			out_list.length = 0;
			continue;
		}

		// Compute the actual position of the value in the map value vector
		const auto pos = inc_list.offset + UnsafeNumericCast<idx_t>(pos_data[pos_idx] - 1);
		out_list.offset = offset;
		out_list.length = 1;
		ListVector::Append(result, val_vec, pos + 1, pos);
		offset++;
	}

	if (args.size() == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(count);
}